

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.h
# Opt level: O0

bool __thiscall Clasp::Asp::PrgNode::assignValueImpl(PrgNode *this,ValueRep v,bool noWeak)

{
  ValueRep VVar1;
  byte in_DL;
  ValueRep in_SIL;
  PrgNode *in_RDI;
  bool local_25;
  ValueRep local_11;
  
  local_11 = in_SIL;
  if ((in_SIL == '\x03') && ((in_DL & 1) != 0)) {
    local_11 = '\x01';
  }
  VVar1 = value(in_RDI);
  if (((VVar1 != '\0') && (VVar1 = value(in_RDI), local_11 != VVar1)) &&
     ((VVar1 = value(in_RDI), VVar1 != '\x03' || (local_11 != '\x01')))) {
    local_25 = false;
    if (local_11 == '\x03') {
      VVar1 = value(in_RDI);
      local_25 = VVar1 == '\x01';
    }
    return local_25;
  }
  setValue(in_RDI,local_11);
  return true;
}

Assistant:

bool assignValueImpl(ValueRep v, bool noWeak) {
		if (v == value_weak_true && noWeak) { v = value_true; }
		if (value() == value_free || v == value() || (value() == value_weak_true && v == value_true)) {
			setValue(v);
			return true;
		}
		return v == value_weak_true && value() == value_true;
	}